

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O2

int __thiscall
Imf_2_5::B44Compressor::uncompress
          (B44Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  long *plVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  int i_1;
  int iVar5;
  int iVar6;
  const_iterator cVar7;
  ConstIterator CVar8;
  ulong uVar9;
  InputExc *this_00;
  ushort uVar10;
  char *pcVar11;
  int x;
  uint uVar12;
  long lVar13;
  size_t sVar14;
  ushort uVar15;
  unsigned_short *puVar16;
  unsigned_short *__dest;
  short sVar17;
  ChannelData *pCVar18;
  int y;
  int iVar19;
  long lVar20;
  B44Compressor *pBVar21;
  int i_3;
  long lVar22;
  char *outEnd;
  short local_b0;
  short local_ae;
  short local_ac;
  short local_aa;
  short local_a8;
  short local_a6;
  short local_a4;
  short local_a2;
  short local_a0;
  short local_9e;
  short local_9c;
  short local_9a;
  int local_94;
  B44Compressor *local_90;
  int local_84;
  unsigned_short *local_80;
  long local_78;
  unsigned_short *local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  ChannelData *local_50;
  unsigned_short *local_48;
  long local_40;
  char **local_38;
  
  *outPtr = this->_outBuffer;
  if (inSize == 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = (range->min).x;
    iVar19 = (range->max).x;
    if (this->_maxX < iVar19) {
      iVar19 = this->_maxX;
    }
    local_80 = (unsigned_short *)CONCAT44(local_80._4_4_,iVar19);
    iVar19 = (range->min).y;
    local_94 = (range->max).y;
    if (this->_maxY < local_94) {
      local_94 = this->_maxY;
    }
    puVar16 = this->_tmpBuffer;
    local_90 = this;
    local_38 = outPtr;
    cVar7._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
    lVar13 = 0;
    while (CVar8 = ChannelList::end(local_90->_channels),
          (const_iterator)cVar7._M_node != CVar8._i._M_node) {
      pCVar18 = local_90->_channelData;
      *(unsigned_short **)((long)&pCVar18->start + lVar13) = puVar16;
      *(unsigned_short **)((long)&pCVar18->end + lVar13) = puVar16;
      iVar5 = numSamples(*(int *)&cVar7._M_node[9].field_0x4,iVar6,(int)local_80);
      *(int *)((long)&pCVar18->nx + lVar13) = iVar5;
      iVar5 = numSamples(*(int *)&cVar7._M_node[9]._M_parent,iVar19,local_94);
      *(int *)((long)&pCVar18->ny + lVar13) = iVar5;
      puVar16 = puVar16 + (long)*(int *)((long)&pCVar18->size + lVar13) *
                          (long)iVar5 * (long)*(int *)((long)&pCVar18->nx + lVar13);
      cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node);
      lVar13 = lVar13 + 0x28;
    }
    lVar13 = 0;
    while (uVar9 = (ulong)local_90->_numChans, lVar13 < (long)uVar9) {
      local_78 = lVar13;
      pCVar18 = local_90->_channelData + lVar13;
      if (local_90->_channelData[lVar13].type == HALF) {
        local_50 = pCVar18;
        uVar12 = 0;
        while ((int)uVar12 < pCVar18->ny) {
          uVar9 = (ulong)pCVar18->nx;
          __dest = pCVar18->start + (int)(pCVar18->nx * uVar12);
          local_70 = __dest + uVar9;
          puVar16 = __dest + uVar9 + uVar9;
          local_48 = puVar16 + uVar9;
          local_58 = uVar12 | 3;
          local_5c = uVar12 | 1;
          local_64 = uVar12;
          local_60 = uVar12 | 2;
          uVar12 = 0;
          while ((int)uVar12 < (int)uVar9) {
            if (inSize < 3) goto LAB_00531c51;
            bVar2 = (byte)*(ushort *)((long)inPtr + 2);
            local_80 = puVar16;
            if (bVar2 == 0xfc) {
              uVar10 = (ushort)(byte)*(ushort *)inPtr << 8;
              uVar15 = (ushort)*(byte *)((long)inPtr + 1) | uVar10 & 0x7fff;
              if (-1 < (short)uVar10) {
                uVar15 = ~CONCAT11((byte)*(ushort *)inPtr,*(byte *)((long)inPtr + 1));
              }
              outEnd = (char *)CONCAT62(outEnd._2_6_,uVar15);
              for (lVar13 = 1; lVar13 != 0x10; lVar13 = lVar13 + 1) {
                *(ushort *)((long)&outEnd + lVar13 * 2) = uVar15;
              }
              local_40 = 3;
              local_84 = -3;
            }
            else {
              if ((uint)inSize < 0xe) goto LAB_00531c51;
              uVar15 = *(ushort *)inPtr << 8 | *(ushort *)inPtr >> 8;
              bVar3 = bVar2 >> 2;
              sVar4 = (short)(-0x20 << (bVar3 & 0x1f));
              sVar17 = uVar15 + sVar4;
              local_b0 = (short)(((bVar2 & 3) << 4 | (uint)(*(byte *)((long)inPtr + 3) >> 4)) <<
                                (bVar3 & 0x1f)) + sVar17;
              iVar6 = (uint)(byte)((byte)*(ushort *)((long)inPtr + 4) >> 6) +
                      (*(byte *)((long)inPtr + 3) & 0xf) * 4;
              local_ae = local_b0 + sVar4;
              local_a8 = (short)(iVar6 << (bVar3 & 0x1f)) + local_ae;
              local_a0 = (short)(((byte)*(ushort *)((long)inPtr + 4) & 0x3f) + iVar6 + -0x20 <<
                                (bVar3 & 0x1f)) + local_ae;
              sVar17 = ((ushort)(*(byte *)((long)inPtr + 5) >> 2) << (bVar3 & 0x1f)) + sVar17;
              outEnd._0_4_ = CONCAT22(sVar17,uVar15);
              local_ae = (short)(((*(byte *)((long)inPtr + 5) & 3) << 4 |
                                 (uint)(byte)((byte)*(ushort *)((long)inPtr + 6) >> 4)) <<
                                (bVar3 & 0x1f)) + local_ae;
              local_a6 = (short)((uint)(*(byte *)((long)inPtr + 7) >> 6) +
                                 ((byte)*(ushort *)((long)inPtr + 6) & 0xf) * 4 << (bVar3 & 0x1f)) +
                         sVar4 + local_a8;
              local_9e = (short)((*(byte *)((long)inPtr + 7) & 0x3f) << (bVar3 & 0x1f)) + sVar4 +
                         local_a0;
              sVar17 = ((ushort)(byte)((byte)*(ushort *)((long)inPtr + 8) >> 2) << (bVar3 & 0x1f)) +
                       sVar4 + sVar17;
              local_ac = (short)((((byte)*(ushort *)((long)inPtr + 8) & 3) << 4 |
                                 (uint)(*(byte *)((long)inPtr + 9) >> 4)) << (bVar3 & 0x1f)) + sVar4
                         + local_ae;
              local_a4 = (short)((uint)(byte)((byte)*(ushort *)((long)inPtr + 10) >> 6) +
                                 (*(byte *)((long)inPtr + 9) & 0xf) * 4 << (bVar3 & 0x1f)) + sVar4 +
                         local_a6;
              local_9c = (short)(((byte)*(ushort *)((long)inPtr + 10) & 0x3f) << (bVar3 & 0x1f)) +
                         sVar4 + local_9e;
              outEnd = (char *)CONCAT26(((ushort)(*(byte *)((long)inPtr + 0xb) >> 2) <<
                                        (bVar3 & 0x1f)) + sVar4 + sVar17,
                                        CONCAT24(sVar17,(int)outEnd));
              local_aa = (short)(((*(byte *)((long)inPtr + 0xb) & 3) << 4 |
                                 (uint)(byte)((byte)*(ushort *)((long)inPtr + 0xc) >> 4)) <<
                                (bVar3 & 0x1f)) + sVar4 + local_ac;
              local_a2 = (short)((uint)(*(byte *)((long)inPtr + 0xd) >> 6) +
                                 ((byte)*(ushort *)((long)inPtr + 0xc) & 0xf) * 4 << (bVar3 & 0x1f))
                         + sVar4 + local_a4;
              local_9a = (short)((*(byte *)((long)inPtr + 0xd) & 0x3f) << (bVar3 & 0x1f)) + sVar4 +
                         local_9c;
              for (uVar9 = (ulong)(uint)(0 << (bVar3 & 0x1f)); uVar9 != 0x10; uVar9 = uVar9 + 1) {
                uVar15 = *(ushort *)((long)&outEnd + uVar9 * 2);
                uVar10 = uVar15 & 0x7fff;
                if (-1 < (short)uVar15) {
                  uVar10 = ~uVar15;
                }
                *(ushort *)((long)&outEnd + uVar9 * 2) = uVar10;
              }
              local_40 = 0xe;
              local_84 = -0xe;
            }
            if (pCVar18->pLinear == true) {
              for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
                *(undefined2 *)((long)&outEnd + lVar13 * 2) =
                     *(undefined2 *)
                      ((anonymous_namespace)::logTable +
                      (ulong)*(ushort *)((long)&outEnd + lVar13 * 2) * 2);
              }
            }
            iVar6 = (pCVar18->nx - uVar12) * 2;
            if ((int)(uVar12 | 3) < pCVar18->nx) {
              iVar6 = 8;
            }
            sVar14 = (size_t)iVar6;
            iVar6 = pCVar18->ny;
            local_54 = uVar12;
            memcpy(__dest,&outEnd,sVar14);
            if ((int)local_58 < iVar6) {
              memcpy(local_70,&local_b0,sVar14);
              puVar16 = local_80;
              memcpy(local_80,&local_a8,sVar14);
              memcpy(local_48,&local_a0,sVar14);
            }
            else {
              iVar6 = pCVar18->ny;
              if ((int)local_5c < iVar6) {
                memcpy(local_70,&local_b0,sVar14);
                iVar6 = local_50->ny;
                pCVar18 = local_50;
              }
              puVar16 = local_80;
              if ((int)local_60 < iVar6) {
                memcpy(local_80,&local_a8,sVar14);
                pCVar18 = local_50;
              }
            }
            inPtr = (char *)((long)inPtr + local_40);
            inSize = inSize + local_84;
            __dest = __dest + 4;
            local_70 = local_70 + 4;
            puVar16 = puVar16 + 4;
            local_48 = local_48 + 4;
            uVar9 = (ulong)(uint)pCVar18->nx;
            uVar12 = local_54 + 4;
          }
          uVar12 = local_64 + 4;
        }
      }
      else {
        iVar5 = pCVar18->nx * pCVar18->ny * pCVar18->size;
        iVar6 = iVar5 * 2;
        if (inSize < iVar6) {
LAB_00531c51:
          anon_unknown_0::notEnoughData();
          goto LAB_00531c56;
        }
        memcpy(pCVar18->start,inPtr,(long)iVar6);
        inPtr = (char *)((long)inPtr + (long)iVar6);
        inSize = inSize + iVar5 * -2;
      }
      lVar13 = local_78 + 1;
    }
    pcVar11 = local_90->_outBuffer;
    pBVar21 = local_90;
    outEnd = pcVar11;
    if (local_90->_format == XDR) {
      for (; iVar19 <= local_94; iVar19 = iVar19 + 1) {
        for (lVar13 = 0; lVar13 < (int)uVar9; lVar13 = lVar13 + 1) {
          pCVar18 = pBVar21->_channelData;
          iVar6 = Imath_2_5::modp(iVar19,pCVar18[lVar13].ys);
          if (iVar6 == 0) {
            iVar6 = pCVar18[lVar13].nx;
            if (pCVar18[lVar13].type == HALF) {
              for (; 0 < iVar6; iVar6 = iVar6 + -1) {
                Xdr::write<Imf_2_5::CharPtrIO,char*>(&outEnd,*pCVar18[lVar13].end);
                pCVar18[lVar13].end = pCVar18[lVar13].end + 1;
              }
            }
            else {
              lVar20 = (long)pCVar18[lVar13].size * (long)iVar6;
              sVar14 = lVar20 * 2;
              memcpy(outEnd,pCVar18[lVar13].end,sVar14);
              outEnd = outEnd + sVar14;
              pCVar18[lVar13].end = pCVar18[lVar13].end + lVar20;
            }
          }
          uVar9 = (ulong)(uint)local_90->_numChans;
          pBVar21 = local_90;
        }
      }
    }
    else {
      for (; iVar19 <= local_94; iVar19 = iVar19 + 1) {
        lVar13 = 8;
        for (lVar20 = 0; lVar20 < (int)uVar9; lVar20 = lVar20 + 1) {
          pCVar18 = pBVar21->_channelData;
          iVar6 = Imath_2_5::modp(iVar19,*(int *)((long)&pCVar18->nx + lVar13));
          if (iVar6 == 0) {
            lVar22 = (long)*(int *)((long)&pCVar18->type + lVar13) *
                     (long)*(int *)((long)&pCVar18->end + lVar13);
            sVar14 = lVar22 * 2;
            memcpy(pcVar11,*(void **)((long)&pCVar18->start + lVar13),sVar14);
            pcVar11 = pcVar11 + lVar22 * 2;
            plVar1 = (long *)((long)&pCVar18->start + lVar13);
            *plVar1 = *plVar1 + sVar14;
            pBVar21 = local_90;
            outEnd = pcVar11;
          }
          uVar9 = (ulong)(uint)pBVar21->_numChans;
          lVar13 = lVar13 + 0x28;
        }
      }
    }
    if (0 < inSize) {
LAB_00531c56:
      this_00 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc
                (this_00,"Error decompressing data (input data are longer than expected).");
      __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    pcVar11 = pBVar21->_outBuffer;
    *local_38 = pcVar11;
    iVar6 = (int)outEnd - (int)pcVar11;
  }
  return iVar6;
}

Assistant:

int
B44Compressor::uncompress (const char *inPtr,
			   int inSize,
			   IMATH_NAMESPACE::Box2i range,
			   const char *&outPtr)
{
    //
    // This function is the reverse of the compress() function,
    // above.  First all pixels are moved from the input buffer
    // into _tmpBuffer.  UINT and FLOAT channels are copied
    // verbatim; HALF channels are uncompressed in blocks of
    // 4x4 pixels.  Then the pixels in _tmpBuffer are copied
    // into the output buffer and rearranged such that the data
    // for for each scan line form a contiguous block.
    //

    outPtr = _outBuffer;

    if (inSize == 0)
    {
	return 0;
    }

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);
    
    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];

	if (cd.type != HALF)
	{
	    //
	    // UINT or FLOAT channel.
	    //

	    int n = cd.nx * cd.ny * cd.size * sizeof (unsigned short);

	    if (inSize < n)
		notEnoughData();

	    memcpy (cd.start, inPtr, n);
	    inPtr += n;
	    inSize -= n;

	    continue;
	}

	//
	// HALF channel
	//

	for (int y = 0; y < cd.ny; y += 4)
	{
	    unsigned short *row0 = cd.start + y * cd.nx;
	    unsigned short *row1 = row0 + cd.nx;
	    unsigned short *row2 = row1 + cd.nx;
	    unsigned short *row3 = row2 + cd.nx;

	    for (int x = 0; x < cd.nx; x += 4)
	    {
		unsigned short s[16]; 

		if (inSize < 3)
		    notEnoughData();

		if (((const unsigned char *)inPtr)[2] == 0xfc)
		{
		    unpack3 ((const unsigned char *)inPtr, s);
		    inPtr += 3;
		    inSize -= 3;
		}
		else
		{
		    if (inSize < 14)
			notEnoughData();

		    unpack14 ((const unsigned char *)inPtr, s);
		    inPtr += 14;
		    inSize -= 14;
		}

		if (cd.pLinear)
		    convertToLinear (s);

		int n = (x + 3 < cd.nx)?
			    4 * sizeof (unsigned short) :
			    (cd.nx - x) * sizeof (unsigned short);

		if (y + 3 < cd.ny)
		{
		    memcpy (row0, &s[ 0], n);
		    memcpy (row1, &s[ 4], n);
		    memcpy (row2, &s[ 8], n);
		    memcpy (row3, &s[12], n);
		}
		else
		{
		    memcpy (row0, &s[ 0], n);

		    if (y + 1 < cd.ny)
			memcpy (row1, &s[ 4], n);

		    if (y + 2 < cd.ny)
			memcpy (row2, &s[ 8], n);
		}

		row0 += 4;
		row1 += 4;
		row2 += 4;
		row3 += 4;
	    }
	}
    }

    char *outEnd = _outBuffer;

    if (_format == XDR)
    {
	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		if (cd.type == HALF)
		{
		    for (int x = cd.nx; x > 0; --x)
		    {
			Xdr::write <CharPtrIO> (outEnd, *cd.end);
			++cd.end;
		    }
		}
		else
		{
		    int n = cd.nx * cd.size;
		    memcpy (outEnd, cd.end, n * sizeof (unsigned short));
		    outEnd += n * sizeof (unsigned short);
		    cd.end += n;
		}
	    }
	}
    }
    else
    {
	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		#if defined (DEBUG)
		    assert (cd.type == HALF);
		#endif

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (outEnd, cd.end, n * sizeof (unsigned short));
		outEnd += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    if (inSize > 0)
	tooMuchData();

    outPtr = _outBuffer;
    return outEnd - _outBuffer;
}